

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

void __thiscall dg::llvmdg::LLVMPTACallGraphImpl::_build(LLVMPTACallGraphImpl *this)

{
  bool bVar1;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *in_RDI;
  StringRef SVar2;
  BasicBlock *B;
  const_iterator __end3;
  const_iterator __begin3;
  Function *__range3;
  Function *cur;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> queue;
  Function *entry;
  string *Str;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_c0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  in_stack_ffffffffffffff48;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *in_stack_ffffffffffffff50;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *in_stack_ffffffffffffff98;
  BasicBlock *in_stack_ffffffffffffffa0;
  Function *in_stack_ffffffffffffffa8;
  LLVMPTACallGraphImpl *in_stack_ffffffffffffffb0;
  size_t local_20;
  
  Str = (string *)
        (in_RDI->_queue).Container.c.
        super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  LLVMPointerAnalysis::getOptions
            (*(LLVMPointerAnalysis **)
              ((long)&(in_RDI->_queue).Container.c.
                      super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      ._M_impl.super__Deque_impl_data._M_start + 8));
  llvm::StringRef::StringRef((StringRef *)in_RDI,Str);
  SVar2.Length = local_20;
  SVar2.Data = (char *)Str;
  llvm::Module::getFunction(SVar2);
  GenericCallGraph<const_llvm::Function_*>::createNode
            ((GenericCallGraph<const_llvm::Function_*> *)in_RDI,(Function **)Str);
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::SetQueue(in_RDI);
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push
            (in_stack_ffffffffffffff50,(ValueType *)in_stack_ffffffffffffff48.NodePtr);
  while (bVar1 = ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::empty
                           ((SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *)0x1904ba),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::pop
              ((SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *)0x1904cf);
    llvm::Function::begin((Function *)Str);
    local_c0.NodePtr = (node_pointer)llvm::Function::end((Function *)Str);
    while (bVar1 = llvm::operator!=((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                                     *)&stack0xffffffffffffff48,&local_c0), bVar1) {
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                   *)0x19051b);
      processBBlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                    in_stack_ffffffffffffff98);
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)in_RDI);
    }
  }
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::~SetQueue(in_RDI);
  return;
}

Assistant:

void _build() {
        auto *entry = _module->getFunction(_pta->getOptions().entryFunction);
        assert(entry && "Entry function not found");
        _cg.createNode(entry);

        ADT::SetQueue<QueueFIFO<const llvm::Function *>> queue;
        queue.push(entry);

        while (!queue.empty()) {
            const auto *cur = queue.pop();
            for (const auto &B : *cur) {
                processBBlock(cur, B, queue);
            }
        }
    }